

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

string * __thiscall efsw::String::toUtf8_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  Uint32 *pUVar1;
  size_type sVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  Uint32 *pUVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = (this->mString)._M_string_length;
  if (0 < (long)sVar2) {
    pUVar3 = (this->mString)._M_dataplus._M_p;
    pUVar1 = pUVar3 + sVar2;
    output.container = __return_storage_ptr__;
    do {
      output = Utf<8u>::Encode<std::back_insert_iterator<std::__cxx11::string>>(*pUVar3,output,'\0')
      ;
      pUVar3 = pUVar3 + 1;
    } while (pUVar3 < pUVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string String::toUtf8() const {
	// Prepare the output string
	std::string output;
	output.reserve(mString.length() + 1);

	// Convert
	Utf32::toUtf8(mString.begin(), mString.end(), std::back_inserter(output) );

	return output;
}